

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlareState.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::FlareState::FlareState
          (FlareState *this,KUINT8 Index,KUINT32 TimeSinceCreation,EntityType *MunitionSource,
          KUINT32 NumberIntensity,KUINT32 NumberOfSources,KUINT16 GeometryIndex)

{
  KUINT8 KVar1;
  KUINT16 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__FlareState_0022d718;
  this->m_ui32TSC = TimeSinceCreation;
  (this->m_Src).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00224d78;
  KVar1 = MunitionSource->m_ui8Domain;
  KVar2 = MunitionSource->m_ui16Country;
  KVar3 = MunitionSource->m_ui8Category;
  KVar4 = MunitionSource->m_ui8SubCategory;
  KVar5 = MunitionSource->m_ui8Specific;
  KVar6 = MunitionSource->m_ui8Extra;
  (this->m_Src).m_ui8EntityKind = MunitionSource->m_ui8EntityKind;
  (this->m_Src).m_ui8Domain = KVar1;
  (this->m_Src).m_ui16Country = KVar2;
  (this->m_Src).m_ui8Category = KVar3;
  (this->m_Src).m_ui8SubCategory = KVar4;
  (this->m_Src).m_ui8Specific = KVar5;
  (this->m_Src).m_ui8Extra = KVar6;
  this->m_ui32NumInt = NumberIntensity;
  this->m_ui32NumSrcs = NumberOfSources;
  this->m_ui16GeometryIndex = GeometryIndex;
  this->m_ui16Padding = 0;
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x103;
  (this->super_EnvironmentRecord).m_ui16Length = 0x100;
  return;
}

Assistant:

FlareState::FlareState( KUINT8 Index, KUINT32 TimeSinceCreation, const EntityType & MunitionSource,
                        KUINT32 NumberIntensity, KUINT32 NumberOfSources, KUINT16 GeometryIndex ) :
    m_ui32TSC( TimeSinceCreation ),
    m_Src( MunitionSource ),
    m_ui32NumInt( NumberIntensity ),
    m_ui32NumSrcs( NumberOfSources ),
    m_ui16GeometryIndex( GeometryIndex ),
    m_ui16Padding( 0 )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = FlareStateType;
    m_ui16Length = FLARE_STATE_SIZE * 8;
}